

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

int __thiscall
QtPrivate::QCalendarDateValidator::countRepeat(QCalendarDateValidator *this,QString *str,int index)

{
  long lVar1;
  QString *this_00;
  qsizetype qVar2;
  int in_EDX;
  QString *in_RSI;
  long in_FS_OFFSET;
  int count;
  QChar ch;
  QChar *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  QString *in_stack_ffffffffffffffc8;
  undefined1 local_29;
  undefined4 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = 1;
  QString::at(in_stack_ffffffffffffffc8,
              CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  while( true ) {
    this_00 = (QString *)(long)(in_EDX + local_28);
    qVar2 = QString::size(in_RSI);
    local_29 = false;
    if ((long)this_00 < qVar2) {
      QString::at(this_00,CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_29 = ::operator==((QChar *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                              ,in_stack_ffffffffffffffb8);
    }
    if (local_29 == false) break;
    local_28 = local_28 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_28;
  }
  __stack_chk_fail();
}

Assistant:

int QCalendarDateValidator::countRepeat(const QString &str, int index) const
{
    Q_ASSERT(index >= 0 && index < str.size());
    int count = 1;
    const QChar ch = str.at(index);
    while (index + count < str.size() && str.at(index + count) == ch)
        ++count;
    return count;
}